

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O1

double __thiscall despot::DESPOT::CheckDESPOT(DESPOT *this,VNode *vnode,double regularized_value)

{
  DSPOMDP *pDVar1;
  bool bVar2;
  double dVar3;
  undefined8 uVar4;
  double dVar5;
  int iVar6;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *pvVar7;
  pointer ppSVar8;
  undefined4 extraout_var;
  VNode *this_00;
  clock_t cVar9;
  VNode *pVVar10;
  clock_t cVar11;
  clock_t cVar12;
  clock_t cVar13;
  ostream *poVar14;
  int iVar15;
  ulong uVar16;
  double pruned_value;
  vector<despot::State_*,_std::allocator<despot::State_*>_> copy;
  RandomStreams streams;
  ACT_TYPE pruned_action;
  double local_b0;
  int local_a4;
  double local_80;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_78;
  History *local_60;
  RandomStreams local_58;
  ACT_TYPE local_34;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "--------------------------------------------------------------------------------",0x50
            );
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  pvVar7 = VNode::particles(vnode);
  local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppSVar8 = (pvVar7->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((pvVar7->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppSVar8) {
    uVar16 = 0;
    do {
      pDVar1 = (this->super_Solver).model_;
      iVar6 = (*pDVar1->_vptr_DSPOMDP[0x16])(pDVar1,ppSVar8[uVar16]);
      local_58.streams_.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar6);
      std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
                ((vector<despot::State*,std::allocator<despot::State*>> *)&local_78,
                 (State **)&local_58);
      uVar16 = uVar16 + 1;
      ppSVar8 = (pvVar7->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar16 < (ulong)((long)(pvVar7->
                                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar8 >> 3
                             ));
  }
  this_00 = (VNode *)operator_new(0x98);
  VNode::VNode(this_00,&local_78,0,(QNode *)0x0,0xffffffffffffffff);
  uVar4 = DAT_00193df0;
  DAT_00193df0 = 0;
  RandomStreams::RandomStreams(&local_58,DAT_00193ddc,DAT_00193de0);
  RandomStreams::position(&local_58,0);
  local_60 = &(this->super_Solver).history_;
  InitBounds(this_00,this->lower_bound_,this->upper_bound_,&local_58,local_60);
  local_a4 = 0;
  local_b0 = 0.0;
  iVar6 = 1;
  do {
    iVar15 = iVar6;
    cVar9 = clock();
    pVVar10 = Trial(this_00,&local_58,this->lower_bound_,this->upper_bound_,
                    (this->super_Solver).model_,local_60,(SearchStatistics *)0x0);
    cVar11 = clock();
    cVar12 = clock();
    Backup(pVVar10);
    cVar13 = clock();
    local_b0 = ((double)cVar13 - (double)cVar12) / 1000000.0 +
               local_b0 + ((double)cVar11 - (double)cVar9) / 1000000.0;
    bVar2 = true;
    if ((double)local_a4 * 0.05 < (double)(iVar15 - local_a4)) {
      DAT_00193df0 = uVar4;
      pVVar10 = Prune(this_00,&local_34,&local_80);
      DAT_00193df0 = 0;
      VNode::Free(pVVar10,(this->super_Solver).model_);
      VNode::~VNode(pVVar10);
      operator_delete(pVVar10,0x98);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# trials = ",0xb);
      poVar14 = (ostream *)std::ostream::operator<<(&std::cout,iVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"; target = ",0xb);
      poVar14 = std::ostream::_M_insert<double>(regularized_value);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,", current = ",0xc);
      dVar5 = local_80;
      poVar14 = std::ostream::_M_insert<double>(local_80);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,", l = ",6);
      dVar3 = VNode::lower_bound(this_00);
      poVar14 = std::ostream::_M_insert<double>(dVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,", u = ",6);
      dVar3 = VNode::upper_bound(this_00);
      poVar14 = std::ostream::_M_insert<double>(dVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"; time = ",9);
      poVar14 = std::ostream::_M_insert<double>(local_b0);
      std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + (char)poVar14);
      std::ostream::put((char)poVar14);
      std::ostream::flush();
      bVar2 = dVar5 < regularized_value;
      local_a4 = iVar15;
      if (bVar2) {
        bVar2 = true;
      }
    }
    iVar6 = iVar15 + 1;
  } while (bVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"DESPOT: # trials = ",0x13);
  poVar14 = (ostream *)std::ostream::operator<<(&std::cout,iVar15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"; target = ",0xb);
  poVar14 = std::ostream::_M_insert<double>(regularized_value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,", current = ",0xc);
  poVar14 = std::ostream::_M_insert<double>(local_80);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,", l = ",6);
  dVar3 = VNode::lower_bound(this_00);
  poVar14 = std::ostream::_M_insert<double>(dVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,", u = ",6);
  dVar3 = VNode::upper_bound(this_00);
  poVar14 = std::ostream::_M_insert<double>(dVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"; time = ",9);
  poVar14 = std::ostream::_M_insert<double>(local_b0);
  std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + (char)poVar14);
  std::ostream::put((char)poVar14);
  std::ostream::flush();
  DAT_00193df0 = uVar4;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "--------------------------------------------------------------------------------",0x50
            );
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  VNode::Free(this_00,(this->super_Solver).model_);
  VNode::~VNode(this_00);
  operator_delete(this_00,0x98);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_58.streams_);
  if (local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return local_b0;
}

Assistant:

double DESPOT::CheckDESPOT(const VNode* vnode, double regularized_value) {
	cout
		<< "--------------------------------------------------------------------------------"
		<< endl;

	const vector<State*>& particles = vnode->particles();
	vector<State*> copy;
	for (int i = 0; i < particles.size(); i ++) {
		copy.push_back(model_->Copy(particles[i]));
	}
	VNode* root = new VNode(copy);

	double pruning_constant = Globals::config.pruning_constant;
	Globals::config.pruning_constant = 0;

	RandomStreams streams = RandomStreams(Globals::config.num_scenarios,
		Globals::config.search_depth);

	streams.position(0);
	InitBounds(root, lower_bound_, upper_bound_, streams, history_);

	double used_time = 0;
	int num_trials = 0, prev_num = 0;
	double pruned_value;
	do {
		double start = clock();
		VNode* cur = Trial(root, streams, lower_bound_, upper_bound_, model_, history_);
		num_trials++;
		used_time += double(clock() - start) / CLOCKS_PER_SEC;

		start = clock();
		Backup(cur);
		used_time += double(clock() - start) / CLOCKS_PER_SEC;

		if (double(num_trials - prev_num) > 0.05 * prev_num) {
			ACT_TYPE pruned_action;
			Globals::config.pruning_constant = pruning_constant;
			VNode* pruned = Prune(root, pruned_action, pruned_value);
			Globals::config.pruning_constant = 0;
			prev_num = num_trials;

			pruned->Free(*model_);
			delete pruned;

			cout << "# trials = " << num_trials << "; target = "
				<< regularized_value << ", current = " << pruned_value
				<< ", l = " << root->lower_bound() << ", u = "
				<< root->upper_bound() << "; time = " << used_time << endl;

			if (pruned_value >= regularized_value) {
				break;
			}
		}
	} while (true);

	cout << "DESPOT: # trials = " << num_trials << "; target = "
		<< regularized_value << ", current = " << pruned_value << ", l = "
		<< root->lower_bound() << ", u = " << root->upper_bound() << "; time = "
		<< used_time << endl;
	Globals::config.pruning_constant = pruning_constant;
	cout
		<< "--------------------------------------------------------------------------------"
		<< endl;

	root->Free(*model_);
	delete root;

	return used_time;
}